

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateCFBundle
          (cmOSXBundleGenerator *this,string *targetName,string *root,string *config)

{
  bool bVar1;
  undefined1 local_f0 [8];
  string name;
  char local_a9;
  undefined1 local_a8 [8];
  string plist;
  string local_70;
  char local_49;
  undefined1 local_48 [8];
  string out;
  string *config_local;
  string *root_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  out.field_2._8_8_ = config;
  bVar1 = MustSkip(this);
  if (!bVar1) {
    local_49 = '/';
    cmGeneratorTarget::GetCFBundleDirectory
              (&local_70,this->GT,(string *)out.field_2._8_8_,FullLevel);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
              ((string *)local_48,root,&local_49,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    register0x00000000 = cmsys::SystemTools::MakeDirectory((string *)local_48,(mode_t *)0x0);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_48);
    local_a9 = '/';
    cmGeneratorTarget::GetCFBundleDirectory
              ((string *)((long)&name.field_2 + 8),this->GT,(string *)out.field_2._8_8_,ContentLevel
              );
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char_const(&)[12]>
              ((string *)local_a8,root,&local_a9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&name.field_2 + 8),(char (*) [12])"/Info.plist");
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    cmsys::SystemTools::GetFilenameName((string *)local_f0,targetName);
    cmLocalGenerator::GenerateAppleInfoPList
              (this->LocalGenerator,this->GT,(string *)local_f0,(string *)local_a8);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateCFBundle(const std::string& targetName,
                                          const std::string& root,
                                          const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, name, plist);
  this->Makefile->AddCMakeOutputFile(plist);
}